

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocman.cpp
# Opt level: O3

void __thiscall despot::PocmanPOMCPPrior::ComputePreference(PocmanPOMCPPrior *this,State *state)

{
  int iVar1;
  iterator iVar2;
  bool bVar3;
  vector<int,std::allocator<int>> *this_00;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  uint local_44;
  int local_40;
  uint local_3c;
  vector<int,std::allocator<int>> *local_38;
  
  if (*(long *)&this->field_0x68 != *(long *)&this->field_0x60) {
    *(long *)&this->field_0x68 = *(long *)&this->field_0x60;
  }
  if (*(long *)&this->field_0x50 != *(long *)&this->field_0x48) {
    *(long *)&this->field_0x50 = *(long *)&this->field_0x48;
  }
  local_38 = (vector<int,std::allocator<int>> *)&this->field_0x48;
  local_40 = 0;
  do {
    uVar5 = Pocman::NextPos(this->pocman_,(Coord *)(state + 0x20),local_40);
    if ((uVar5 & 0x8000000080000000) == 0) {
      iVar2._M_current = *(int **)&this->field_0x68;
      if (iVar2._M_current == *(int **)&this->field_0x70) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&this->field_0x60,iVar2,&local_40);
      }
      else {
        *iVar2._M_current = local_40;
        *(int **)&this->field_0x68 = iVar2._M_current + 1;
      }
    }
    this_00 = local_38;
    iVar1 = local_40 + 1;
    bVar3 = local_40 < 3;
    local_40 = iVar1;
  } while (bVar3);
  if (*(long *)&this->field_0x18 != *(long *)&this->field_0x10) {
    iVar1 = *(int *)(*(long *)&this->field_0x18 + -4);
    uVar5 = *(ulong *)(*(long *)&this->field_0x30 + -8);
    uVar6 = (uint)uVar5;
    if ((*(int *)(state + 0x84) < 1) || ((uVar5 & 0xf) == 0)) {
      local_44 = 0;
      do {
        uVar5 = Pocman::NextPos(this->pocman_,(Coord *)(state + 0x20),local_44);
        if ((((uVar5 & 0x8000000080000000) == 0) && ((uVar6 >> (local_44 & 0x1f) & 1) == 0)) &&
           (iVar4 = despot::Compass::Opposite(local_44), iVar4 != iVar1)) {
          iVar2._M_current = *(int **)&this->field_0x50;
          if (iVar2._M_current == *(int **)&this->field_0x58) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      (local_38,iVar2,(int *)&local_44);
          }
          else {
            *iVar2._M_current = local_44;
            *(int **)&this->field_0x50 = iVar2._M_current + 1;
          }
        }
        bVar3 = (int)local_44 < 3;
        local_44 = local_44 + 1;
      } while (bVar3);
    }
    else {
      local_3c = 0;
      do {
        if ((uVar6 >> (local_3c & 0x1f) & 1) != 0) {
          iVar2._M_current = *(int **)&this->field_0x50;
          if (iVar2._M_current == *(int **)&this->field_0x58) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      (this_00,iVar2,(int *)&local_3c);
          }
          else {
            *iVar2._M_current = local_3c;
            *(int **)&this->field_0x50 = iVar2._M_current + 1;
          }
        }
        bVar3 = (int)local_3c < 3;
        local_3c = local_3c + 1;
      } while (bVar3);
    }
  }
  return;
}

Assistant:

void ComputePreference(const State& state) {
		const PocmanState& pocstate = static_cast<const PocmanState&>(state);
		legal_actions_.clear();
		preferred_actions_.clear();

		for (int a = 0; a < 4; a++) {
			Coord newpos = pocman_->NextPos(pocstate.pocman_pos, a);
			if (newpos.x >= 0 && newpos.y >= 0)
				legal_actions_.push_back(a);
		}

		if (history_.Size()) {
			ACT_TYPE action = history_.LastAction();
			OBS_TYPE observation = history_.LastObservation();

			// If power pill and can see a ghost then chase it
			if (pocstate.power_steps > 0 && ((observation & 15) != 0)) {
				for (int a = 0; a < 4; a++)
					if (CheckFlag(observation, a))
						preferred_actions_.push_back(a);
			} else { // Otherwise avoid observed ghosts and avoid changing directions
				for (int a = 0; a < 4; a++) {
					Coord newpos = pocman_->NextPos(pocstate.pocman_pos, a);
					if (newpos.x >= 0 && newpos.y >= 0
						&& !CheckFlag(observation, a)
						&& Compass::Opposite(a) != action)
						preferred_actions_.push_back(a);
				}
			}
		}
	}